

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O2

void SingleTreeSearchHelper
               (ON_RTreeNode *a_nodeA,ON_RTreeNode *a_nodeB,
               ON_RTreePairSearchCallbackResult *a_result)

{
  ON_RTreeBranch *pOVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 *paVar5;
  ON_RTreeBranch *a_branchA;
  
  a_branchA = a_nodeA->m_branch;
  iVar2 = a_nodeA->m_count;
  iVar3 = a_nodeB->m_count;
  if ((a_nodeA->m_level < 1) && (a_nodeB->m_level < 1)) {
    for (; paVar5 = &a_nodeB->m_branch[0].field_1, a_branchA < a_nodeA->m_branch + iVar2;
        a_branchA = a_branchA + 1) {
      for (; pOVar1 = (ON_RTreeBranch *)(paVar5 + -6), pOVar1 < a_nodeB->m_branch + iVar3;
          paVar5 = paVar5 + 7) {
        if ((a_branchA < pOVar1) &&
           (bVar4 = PairSearchOverlapHelper
                              (&a_branchA->m_rect,(ON_RTreeBBox *)pOVar1,a_result->m_tolerance),
           bVar4)) {
          (*a_result->m_resultCallback)
                    (a_result->m_context,(ON__INT_PTR)(a_branchA->field_1).m_child,
                     (ON__INT_PTR)paVar5->m_child);
        }
      }
    }
  }
  else {
    for (; paVar5 = &a_nodeB->m_branch[0].field_1, a_branchA < a_nodeA->m_branch + iVar2;
        a_branchA = a_branchA + 1) {
      for (; pOVar1 = (ON_RTreeBranch *)(paVar5 + -6), pOVar1 < a_nodeB->m_branch + iVar3;
          paVar5 = paVar5 + 7) {
        bVar4 = PairSearchOverlapHelper
                          (&a_branchA->m_rect,(ON_RTreeBBox *)pOVar1,a_result->m_tolerance);
        if (bVar4) {
          if (a_nodeA->m_level < 1) {
            SingleTreeSearchHelper(a_branchA,paVar5->m_child,a_result);
          }
          else if (a_nodeB->m_level < 1) {
            SingleTreeSearchHelper((a_branchA->field_1).m_child,pOVar1,a_result);
          }
          else {
            SingleTreeSearchHelper((a_branchA->field_1).m_child,paVar5->m_child,a_result);
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void SingleTreeSearchHelper(const ON_RTreeNode* a_nodeA, const ON_RTreeNode* a_nodeB, ON_RTreePairSearchCallbackResult* a_result)
{
  // DO NOT ADD ANYTHING TO THIS FUNCTION
  const ON_RTreeBranch *branchA, *branchAmax, *branchB, *branchBmax;

  branchA = a_nodeA->m_branch;
  branchAmax = branchA + a_nodeA->m_count;
  branchBmax = a_nodeB->m_branch + a_nodeB->m_count;

  if (a_nodeA->m_level > 0 || a_nodeB->m_level > 0)
  {
    while (branchA < branchAmax)
    {
      for (branchB = a_nodeB->m_branch; branchB < branchBmax; branchB++)
      {
        if (PairSearchOverlapHelper(&branchA->m_rect, &branchB->m_rect, a_result->m_tolerance))
        {
          if (a_nodeA->m_level > 0)
          {
            if (a_nodeB->m_level > 0)
              SingleTreeSearchHelper(branchA->m_child, branchB->m_child, a_result);
            else
              SingleTreeSearchHelper(branchA->m_child, branchB, a_result);
          }
          else // a_nodeB->m_level > 0
          {
            SingleTreeSearchHelper(branchA, branchB->m_child, a_result);
          }
        }
      }
      branchA++;
    }
  }
  else
  {
    while (branchA < branchAmax)
    {
      for (branchB = a_nodeB->m_branch; branchB < branchBmax; branchB++)
      {
        // branchA and branchB are leaf nodes in the same same tree.
        // Don't test pairs twice and don't test a node against itself.
        if (branchA < branchB)
        {
          if (PairSearchOverlapHelper(&branchA->m_rect, &branchB->m_rect, a_result->m_tolerance))
          {
            a_result->m_resultCallback(a_result->m_context, branchA->m_id, branchB->m_id);
          }
        }
      }
      branchA++;
    }
  }

}